

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetLinkerLanguage
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  LinkClosure *pLVar1;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  pLVar1 = GetLinkClosure(this,config);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pLVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerLanguage(
  const std::string& config) const
{
  return this->GetLinkClosure(config)->LinkerLanguage;
}